

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ImplicitWeakMessage::ByteSizeLong(ImplicitWeakMessage *this)

{
  size_t sVar1;
  
  if (this->data_ == (string *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = this->data_->_M_string_length;
  }
  if (((int)sVar1 != 0) || ((this->cached_size_).atom_ != 0)) {
    (this->cached_size_).atom_ = (int)sVar1;
  }
  return sVar1;
}

Assistant:

size_t ByteSizeLong() const PROTOBUF_FINAL {
    size_t size = data_ == nullptr ? 0 : data_->size();
    cached_size_.Set(internal::ToCachedSize(size));
    return size;
  }